

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_3_channels_with_n_coeffs_mod2
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  __m128 d;
  __m128 cs;
  __m128 c;
  __m128 tot2;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *pfStack_4e8;
  int n;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_4c8;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float local_2f8;
  float fStack_2f4;
  float fStack_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2a0;
  float local_298;
  float fStack_294;
  float local_288;
  float fStack_284;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  
  decode = output_buffer;
  pfStack_4c8 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  while( true ) {
    pfVar3 = decode_buffer + (int)*horizontal_coefficients_local * 3;
    hc._4_4_ = ((int)horizontal_coefficients_local[1] - (int)*horizontal_coefficients_local) + -2 >>
               2;
    tot0._8_8_ = pfStack_4c8;
    local_298 = (float)*(undefined8 *)pfStack_4c8;
    fStack_294 = (float)((ulong)*(undefined8 *)pfStack_4c8 >> 0x20);
    local_1a8 = (float)*(undefined8 *)pfVar3;
    fStack_1a4 = (float)((ulong)*(undefined8 *)pfVar3 >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)(pfVar3 + 2);
    fStack_19c = (float)((ulong)*(undefined8 *)(pfVar3 + 2) >> 0x20);
    tot1[2] = local_298 * local_1a8;
    tot1[3] = local_298 * fStack_1a4;
    tot0[0] = local_298 * fStack_1a0;
    tot0[1] = fStack_294 * fStack_19c;
    fStack_2a0 = (float)*(undefined8 *)(pfStack_4c8 + 2);
    local_1c8 = (float)*(undefined8 *)(pfVar3 + 4);
    fStack_1c4 = (float)((ulong)*(undefined8 *)(pfVar3 + 4) >> 0x20);
    fStack_1c0 = (float)*(undefined8 *)(pfVar3 + 6);
    fStack_1bc = (float)((ulong)*(undefined8 *)(pfVar3 + 6) >> 0x20);
    tot2[2] = fStack_294 * local_1c8;
    tot2[3] = fStack_294 * fStack_1c4;
    tot1[0] = fStack_2a0 * fStack_1c0;
    tot1[1] = fStack_2a0 * fStack_1bc;
    fVar7 = (float)((ulong)*(undefined8 *)(pfStack_4c8 + 2) >> 0x20);
    local_1e8 = (float)*(undefined8 *)(pfVar3 + 8);
    fStack_1e4 = (float)((ulong)*(undefined8 *)(pfVar3 + 8) >> 0x20);
    fStack_1e0 = (float)*(undefined8 *)(pfVar3 + 10);
    fStack_1dc = (float)((ulong)*(undefined8 *)(pfVar3 + 10) >> 0x20);
    c[2] = fStack_2a0 * local_1e8;
    c[3] = fVar7 * fStack_1e4;
    tot2[0] = fVar7 * fStack_1e0;
    tot2[1] = fVar7 * fStack_1dc;
    puVar2 = (undefined8 *)tot0._8_8_;
    do {
      pfStack_4e8 = pfVar3;
      tot0._8_8_ = puVar2;
      uVar1 = *(undefined8 *)(tot0._8_8_ + 0x10);
      local_2c8 = (float)uVar1;
      fStack_2c4 = (float)((ulong)uVar1 >> 0x20);
      uVar1 = *(undefined8 *)(pfStack_4e8 + 0xc);
      local_208 = (float)uVar1;
      fStack_204 = (float)((ulong)uVar1 >> 0x20);
      fStack_200 = (float)*(undefined8 *)(pfStack_4e8 + 0xe);
      fStack_1fc = (float)((ulong)*(undefined8 *)(pfStack_4e8 + 0xe) >> 0x20);
      tot1[2] = tot1[2] + local_2c8 * local_208;
      tot1[3] = tot1[3] + local_2c8 * fStack_204;
      tot0[0] = tot0[0] + local_2c8 * fStack_200;
      tot0[1] = tot0[1] + fStack_2c4 * fStack_1fc;
      fStack_2d0 = (float)*(undefined8 *)(tot0._8_8_ + 0x18);
      local_228 = (float)*(undefined8 *)(pfStack_4e8 + 0x10);
      fStack_224 = (float)((ulong)*(undefined8 *)(pfStack_4e8 + 0x10) >> 0x20);
      fStack_220 = (float)*(undefined8 *)(pfStack_4e8 + 0x12);
      fStack_21c = (float)((ulong)*(undefined8 *)(pfStack_4e8 + 0x12) >> 0x20);
      tot2[2] = tot2[2] + fStack_2c4 * local_228;
      tot2[3] = tot2[3] + fStack_2c4 * fStack_224;
      tot1[0] = tot1[0] + fStack_2d0 * fStack_220;
      tot1[1] = tot1[1] + fStack_2d0 * fStack_21c;
      fVar7 = (float)((ulong)*(undefined8 *)(tot0._8_8_ + 0x18) >> 0x20);
      local_248 = (float)*(undefined8 *)(pfStack_4e8 + 0x14);
      fStack_244 = (float)((ulong)*(undefined8 *)(pfStack_4e8 + 0x14) >> 0x20);
      fStack_240 = (float)*(undefined8 *)(pfStack_4e8 + 0x16);
      fStack_23c = (float)((ulong)*(undefined8 *)(pfStack_4e8 + 0x16) >> 0x20);
      c[2] = c[2] + fStack_2d0 * local_248;
      c[3] = c[3] + fVar7 * fStack_244;
      tot2[0] = tot2[0] + fVar7 * fStack_240;
      tot2[1] = tot2[1] + fVar7 * fStack_23c;
      hc._4_4_ = hc._4_4_ + -1;
      puVar2 = (undefined8 *)(tot0._8_8_ + 0x10);
      pfVar3 = pfStack_4e8 + 0xc;
    } while (0 < hc._4_4_);
    local_2f8 = (float)*(undefined8 *)(tot0._8_8_ + 0x20);
    fStack_2f4 = (float)((ulong)*(undefined8 *)(tot0._8_8_ + 0x20) >> 0x20);
    local_268 = (float)*(undefined8 *)(pfStack_4e8 + 0x18);
    fStack_264 = (float)((ulong)*(undefined8 *)(pfStack_4e8 + 0x18) >> 0x20);
    fStack_260 = (float)*(undefined8 *)(pfStack_4e8 + 0x1a);
    fStack_25c = (float)((ulong)*(undefined8 *)(pfStack_4e8 + 0x1a) >> 0x20);
    fVar5 = tot0[0] + local_2f8 * fStack_260;
    fVar8 = tot0[1] + fStack_2f4 * fStack_25c;
    local_288 = (float)*(undefined8 *)(pfStack_4e8 + 0x1c);
    fStack_284 = (float)((ulong)*(undefined8 *)(pfStack_4e8 + 0x1c) >> 0x20);
    fVar7 = tot1[2] + local_2f8 * local_268 + tot1[0] + 0.0 + fVar8 + c[3];
    fVar4 = tot1[3] + local_2f8 * fStack_264 + tot1[1] + 0.0 +
            tot2[2] + fStack_2f4 * local_288 + tot2[0];
    fVar6 = fVar5 + c[2] + tot2[3] + fStack_2f4 * fStack_284 + tot2[1];
    pfStack_4c8 = pfStack_4c8 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    pfVar3 = decode + 3;
    if (output_buffer + output_sub_size * 3 <= pfVar3) break;
    *(ulong *)decode = CONCAT44(fVar4,fVar7);
    *(ulong *)(decode + 2) = CONCAT44(fVar8 + c[3] + fVar5 + c[2],fVar6);
    decode = pfVar3;
    if (output_buffer + output_sub_size * 3 <= pfVar3) {
      return;
    }
  }
  *(ulong *)decode = CONCAT44(fVar4,fVar7);
  decode[2] = fVar6;
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod2 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 6 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__2_coeff_remnant( 4 );

    stbir__store_output();
  } while ( output < output_end );
}